

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O1

int AF_A_FAxeAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  player_t *ppVar4;
  APlayerPawn *t1;
  AWeapon *pAVar5;
  AAmmo *pAVar6;
  AActor *pAVar7;
  PClass *pPVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  PClass *pPVar12;
  FState *pFVar13;
  undefined4 in_register_00000014;
  VMValue *pVVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  FTranslatedLineTarget t;
  uint local_d0;
  int local_cc;
  FName local_bc;
  player_t *local_b8;
  double local_b0;
  PClassActor *local_a8;
  DAngle local_a0;
  DAngle local_98;
  DAngle local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  FName local_70;
  FName local_6c;
  FTranslatedLineTarget local_68;
  DAngle local_48;
  DObject *local_40;
  AActor *local_38;
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  uVar11 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar15 = "(paramnum) < numparam";
    goto LAB_005b37cf;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    pVVar14 = param;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        auVar21 = (**(code **)*puVar2)(puVar2);
        uVar11 = auVar21._8_8_;
        puVar2[1] = auVar21._0_8_;
      }
      pPVar12 = (PClass *)puVar2[1];
      bVar20 = pPVar12 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar20;
      uVar11 = CONCAT71((int7)((ulong)uVar11 >> 8),bVar20);
      pVVar14 = (VMValue *)(ulong)(pPVar12 == pPVar8 || bVar20);
      if (pPVar12 != pPVar8 && !bVar20) {
        do {
          pPVar12 = pPVar12->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar12 != (PClass *)0x0);
          if (pPVar12 == pPVar8) break;
        } while (pPVar12 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar15 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b37cf;
      }
    }
    pPVar8 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b37a4;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar11 = (**(code **)*puVar3)(puVar3,pVVar14,uVar11,ret);
          puVar3[1] = uVar11;
        }
        pPVar12 = (PClass *)puVar3[1];
        bVar20 = pPVar12 != (PClass *)0x0;
        if (pPVar12 != pPVar8 && bVar20) {
          do {
            pPVar12 = pPVar12->ParentClass;
            bVar20 = pPVar12 != (PClass *)0x0;
            if (pPVar12 == pPVar8) break;
          } while (pPVar12 != (PClass *)0x0);
        }
        if (!bVar20) {
          pcVar15 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b37cf;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      ppVar4 = (player_t *)puVar2[0x40];
      if (ppVar4 != (player_t *)0x0) {
        t1 = ppVar4->mo;
        uVar9 = FRandom::GenRand32(&pr_axeatk);
        uVar10 = FRandom::GenRand32(&pr_axeatk);
        local_cc = (uVar9 & 0xf) + (uVar10 & 7) + 0x28;
        iVar19 = 0;
        bVar20 = (((ppVar4->ReadyWeapon->Ammo1).field_0.p)->super_AInventory).Amount < 1;
        if (bVar20) {
          local_b0 = 0.0;
          pcVar15 = "AxePuff";
        }
        else {
          local_cc = local_cc * 2;
          local_b0 = 6.0;
          pcVar15 = "AxePuffGlow";
        }
        local_d0 = (uint)!bVar20;
        local_b8 = ppVar4;
        local_a8 = PClass::FindActor(pcVar15);
        iVar18 = 0;
        do {
          iVar16 = 3;
          iVar17 = iVar18;
          do {
            pAVar7 = (AActor *)((double)iVar17 * 2.8125 + (t1->super_AActor).Angles.Yaw.Degrees);
            local_88 = 0;
            local_80._0_8_ = pAVar7;
            P_AimLineAttack((AActor *)(local_80 + 8),(DAngle *)t1,144.0,
                            (FTranslatedLineTarget *)local_80,(DAngle *)&local_68,(int)&local_88,
                            (AActor *)0x0,(AActor *)0x0);
            if (local_68.linetarget != (AActor *)0x0) {
              local_98.Degrees = (double)local_80._8_8_;
              local_bc.Index = 0x84;
              local_90.Degrees = (double)pAVar7;
              P_LineAttack(&t1->super_AActor,&local_90,144.0,&local_98,local_cc,&local_bc,local_a8,1
                           ,&local_68,(int *)0x0);
              if (local_68.linetarget != (AActor *)0x0) {
                if (((((local_68.linetarget)->flags3).Value & 0x2000) != 0) ||
                   ((local_68.linetarget)->player != (player_t *)0x0)) {
                  local_a0.Degrees = local_68.angleFromSource.Degrees;
                  AActor::Thrust(local_68.linetarget,&local_a0,local_b0);
                }
                AdjustPlayerAngle(&t1->super_AActor,&local_68);
                local_d0 = local_d0 + 1;
                iVar17 = 8;
                goto LAB_005b35da;
              }
            }
            iVar17 = iVar17 + iVar19;
            bVar20 = SCARRY4(iVar16,-2);
            iVar16 = iVar16 + -2;
          } while (iVar16 != 0 && bVar20 == iVar16 < 0);
          iVar17 = 5;
LAB_005b35da:
          if (iVar17 != 5) {
            if (iVar17 != 8) {
              return 0;
            }
            goto LAB_005b36b3;
          }
          iVar18 = iVar18 + 1;
          iVar19 = iVar19 + -2;
        } while (iVar18 != 0x10);
        (t1->super_AActor).weaponspecial = 0;
        pAVar7 = (AActor *)(t1->super_AActor).Angles.Yaw.Degrees;
        local_40 = (DObject *)0x0;
        local_38 = pAVar7;
        P_AimLineAttack((AActor *)&stack0xffffffffffffffb0,(DAngle *)t1,64.0,
                        (FTranslatedLineTarget *)&stack0xffffffffffffffc8,(DAngle *)0x0,
                        (int)&stack0xffffffffffffffc0,(AActor *)0x0,(AActor *)0x0);
        local_6c.Index = 0x84;
        local_48.Degrees = (double)pAVar7;
        P_LineAttack(&t1->super_AActor,&stack0xffffffffffffffb8,64.0,
                     (DAngle *)&stack0xffffffffffffffb0,local_cc,&local_6c,local_a8,1,
                     (FTranslatedLineTarget *)0x0,(int *)0x0);
LAB_005b36b3:
        ppVar4 = local_b8;
        if ((local_d0 == 2) && (pAVar5 = local_b8->ReadyWeapon, pAVar5 != (AWeapon *)0x0)) {
          AWeapon::DepleteAmmo(pAVar5,pAVar5->bAltFire,false,-1);
          pAVar6 = (pAVar5->Ammo1).field_0.p;
          if (pAVar6 != (AAmmo *)0x0) {
            if (((pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags &
                0x20) == 0) {
              if ((((pAVar5->Ammo1).field_0.p)->super_AInventory).Amount != 0) {
                return 0;
              }
            }
            else {
              (pAVar5->Ammo1).field_0.p = (AAmmo *)0x0;
            }
          }
          if ((((pAVar5->super_AInventory).field_0x4dc & 0x80) != 0) &&
             (pAVar6 = (pAVar5->Ammo2).field_0.p, pAVar6 != (AAmmo *)0x0)) {
            if (((pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags &
                0x20) == 0) {
              if ((((pAVar5->Ammo2).field_0.p)->super_AInventory).Amount != 0) {
                return 0;
              }
            }
            else {
              (pAVar5->Ammo2).field_0.p = (AAmmo *)0x0;
            }
          }
          pAVar5 = ppVar4->ReadyWeapon;
          local_70.Index = FName::NameManager::FindName(&FName::NameData,"Fire",false);
          pFVar13 = AActor::FindState((AActor *)pAVar5,&local_70);
          P_SetPsprite(ppVar4,PSP_WEAPON,pFVar13 + 5,false);
        }
      }
      return 0;
    }
    pcVar15 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b37a4:
    pcVar15 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b37cf:
  __assert_fail(pcVar15,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeAttack)
{
	PARAM_ACTION_PROLOGUE;

	DAngle angle;
	int power;
	int damage;
	DAngle slope;
	int i;
	int useMana;
	player_t *player;
	AWeapon *weapon;
	PClassActor *pufftype;
	FTranslatedLineTarget t;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	AActor *pmo=player->mo;

	damage = 40+(pr_axeatk()&15);
	damage += pr_axeatk()&7;
	power = 0;
	weapon = player->ReadyWeapon;
	if (player->ReadyWeapon->Ammo1->Amount > 0)
	{
		damage <<= 1;
		power = 6;
		pufftype = PClass::FindActor ("AxePuffGlow");
		useMana = 1;
	}
	else
	{
		pufftype = PClass::FindActor ("AxePuff");
		useMana = 0;
	}
	for (i = 0; i < 16; i++)
	{
		for (int j = 1; j >= -1; j -= 2)
		{
			angle = pmo->Angles.Yaw + j*i*(45. / 16);
			slope = P_AimLineAttack(pmo, angle, AXERANGE, &t);
			if (t.linetarget)
			{
				P_LineAttack(pmo, angle, AXERANGE, slope, damage, NAME_Melee, pufftype, true, &t);
				if (t.linetarget != nullptr)
				{
					if (t.linetarget->flags3&MF3_ISMONSTER || t.linetarget->player)
					{
						t.linetarget->Thrust(t.angleFromSource, power);
					}
					AdjustPlayerAngle(pmo, &t);
					useMana++;
					goto axedone;
				}
			}
		}
	}
	// didn't find any creatures, so try to strike any walls
	pmo->weaponspecial = 0;

	angle = pmo->Angles.Yaw;
	slope = P_AimLineAttack (pmo, angle, MELEERANGE);
	P_LineAttack (pmo, angle, MELEERANGE, slope, damage, NAME_Melee, pufftype, true);

axedone:
	if (useMana == 2)
	{
		AWeapon *weapon = player->ReadyWeapon;
		if (weapon != nullptr)
		{
			weapon->DepleteAmmo (weapon->bAltFire, false);

			if ((weapon->Ammo1 == nullptr || weapon->Ammo1->Amount == 0) &&
				(!(weapon->WeaponFlags & WIF_PRIMARY_USES_BOTH) ||
				  weapon->Ammo2 == nullptr || weapon->Ammo2->Amount == 0))
			{
				P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("Fire") + 5);
			}
		}
	}
	return 0;		
}